

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::BinaryLogLoss::forward_impl
          (BinaryLogLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  uint uVar1;
  ulong uVar2;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  float fVar3;
  size_t i;
  float dist;
  size_t s;
  FBinaryLogLoss bll;
  Tensor y;
  Tensor x;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Tensor *in_stack_ffffffffffffff30;
  ulong uVar4;
  undefined4 local_c4;
  FBinaryLogLoss *in_stack_ffffffffffffff48;
  
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
  Tensor::Tensor(in_stack_ffffffffffffff30,
                 (Tensor *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,1);
  Tensor::Tensor(in_stack_ffffffffffffff30,
                 (Tensor *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  uVar1 = Dim::size(&in_stack_ffffffffffffff30->d);
  uVar2 = (ulong)uVar1;
  local_c4 = 0.0;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    fVar3 = FBinaryLogLoss::operator()
                      (in_stack_ffffffffffffff48,(float)(uVar2 >> 0x20),(float)uVar2);
    local_c4 = fVar3 + local_c4;
  }
  **(float **)(in_RDX + 0x28) = local_c4;
  Tensor::~Tensor((Tensor *)0x4ef37f);
  Tensor::~Tensor((Tensor *)0x4ef389);
  return;
}

Assistant:

void BinaryLogLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("BinaryLogLoss not yet implemented for CUDA");
#else
  auto x = *xs[0];
  auto y = *xs[1];
  FBinaryLogLoss bll;
  const size_t s = x.d.size();
  float dist = 0;
  for (size_t i = 0; i < s; ++i)
    dist += bll(x.v[i], y.v[i]);
  fx.v[0] = dist;
#endif
}